

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
pstore::json::details::number_matcher<pstore::json::null_output>::make_result
          (number_matcher<pstore::json::null_output> *this,parser<pstore::json::null_output> *parser
          )

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  null_output *pnVar4;
  error_code eVar5;
  int64_t local_c0;
  error_code local_98;
  error_code local_88;
  error_code local_78;
  double local_68;
  __type_conflict5 exp;
  double xf;
  error_category *local_50;
  error_code local_48;
  error_code local_38;
  undefined8 local_28;
  uint64_t umin;
  long min;
  parser<pstore::json::null_output> *parser_local;
  number_matcher<pstore::json::null_output> *this_local;
  
  min = (long)parser;
  parser_local = (parser<pstore::json::null_output> *)this;
  bVar2 = parser<pstore::json::null_output>::has_error(parser);
  if (!bVar2) {
    bVar2 = in_terminal_state(this);
    lVar1 = min;
    if (!bVar2) {
      assert_failed("this->in_terminal_state ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                    ,0x31d);
    }
    if (((this->super_matcher<pstore::json::null_output>).field_0xd & 1) == 0) {
      exp = (this->fp_acc_).whole_part + (this->fp_acc_).frac_part / (this->fp_acc_).frac_scale;
      local_68 = std::pow<int,unsigned_int>(10,(this->fp_acc_).exponent);
      uVar3 = std::isinf(local_68);
      lVar1 = min;
      if ((uVar3 & 1) == 0) {
        if (((this->fp_acc_).exp_is_negative & 1U) != 0) {
          local_68 = 1.0 / local_68;
        }
        exp = local_68 * exp;
        if (((this->super_matcher<pstore::json::null_output>).field_0xc & 1) != 0) {
          exp = -exp;
        }
        uVar3 = std::isinf(exp);
        if (((uVar3 & 1) == 0) && (uVar3 = std::isnan(exp), lVar1 = min, (uVar3 & 1) == 0)) {
          pnVar4 = parser<pstore::json::null_output>::callbacks
                             ((parser<pstore::json::null_output> *)min);
          eVar5 = null_output::double_value(pnVar4,exp);
          local_98._M_cat = eVar5._M_cat;
          local_98._M_value = eVar5._M_value;
          matcher<pstore::json::null_output>::set_error
                    (&this->super_matcher<pstore::json::null_output>,
                     (parser<pstore::json::null_output> *)lVar1,&local_98);
        }
        else {
          lVar1 = min;
          std::error_code::error_code<pstore::json::error_code,void>(&local_88,number_out_of_range);
          matcher<pstore::json::null_output>::set_error
                    (&this->super_matcher<pstore::json::null_output>,
                     (parser<pstore::json::null_output> *)lVar1,&local_88);
        }
      }
      else {
        std::error_code::error_code<pstore::json::error_code,void>(&local_78,number_out_of_range);
        matcher<pstore::json::null_output>::set_error
                  (&this->super_matcher<pstore::json::null_output>,
                   (parser<pstore::json::null_output> *)lVar1,&local_78);
      }
    }
    else {
      umin = 0x8000000000000000;
      local_28 = 0x8000000000000000;
      if (((this->super_matcher<pstore::json::null_output>).field_0xc & 1) == 0) {
        pnVar4 = parser<pstore::json::null_output>::callbacks
                           ((parser<pstore::json::null_output> *)min);
        eVar5 = null_output::uint64_value(pnVar4,this->int_acc_);
        local_50 = eVar5._M_cat;
        xf._0_4_ = eVar5._M_value;
        matcher<pstore::json::null_output>::set_error
                  (&this->super_matcher<pstore::json::null_output>,
                   (parser<pstore::json::null_output> *)lVar1,(error_code *)&xf);
      }
      else if (this->int_acc_ < 0x8000000000000001) {
        pnVar4 = parser<pstore::json::null_output>::callbacks
                           ((parser<pstore::json::null_output> *)min);
        if (this->int_acc_ == 0x8000000000000000) {
          local_c0 = -0x8000000000000000;
        }
        else {
          local_c0 = -this->int_acc_;
        }
        eVar5 = null_output::int64_value(pnVar4,local_c0);
        local_48._M_cat = eVar5._M_cat;
        local_48._M_value = eVar5._M_value;
        matcher<pstore::json::null_output>::set_error
                  (&this->super_matcher<pstore::json::null_output>,
                   (parser<pstore::json::null_output> *)lVar1,&local_48);
      }
      else {
        std::error_code::error_code<pstore::json::error_code,void>(&local_38,number_out_of_range);
        matcher<pstore::json::null_output>::set_error
                  (&this->super_matcher<pstore::json::null_output>,
                   (parser<pstore::json::null_output> *)lVar1,&local_38);
      }
    }
  }
  return;
}

Assistant:

void number_matcher<Callbacks>::make_result (parser<Callbacks> & parser) {
                if (parser.has_error ()) {
                    return;
                }
                PSTORE_ASSERT (this->in_terminal_state ());

                if (is_integer_) {
                    constexpr auto min = std::numeric_limits<std::int64_t>::min ();
                    constexpr auto umin = static_cast<std::uint64_t> (min);

                    if (is_neg_) {
                        if (int_acc_ > umin) {
                            this->set_error (parser, error_code::number_out_of_range);
                            return;
                        }

                        this->set_error (
                            parser,
                            parser.callbacks ().int64_value (
                                (int_acc_ == umin) ? min : -static_cast<std::int64_t> (int_acc_)));
                        return;
                    }
                    this->set_error (parser, parser.callbacks ().uint64_value (int_acc_));
                    return;
                }

                auto xf = (fp_acc_.whole_part + fp_acc_.frac_part / fp_acc_.frac_scale);
                auto exp = std::pow (10, fp_acc_.exponent);
                if (std::isinf (exp)) {
                    this->set_error (parser, error_code::number_out_of_range);
                    return;
                }
                if (fp_acc_.exp_is_negative) {
                    exp = 1.0 / exp;
                }

                xf *= exp;
                if (is_neg_) {
                    xf = -xf;
                }

                if (std::isinf (xf) || std::isnan (xf)) {
                    this->set_error (parser, error_code::number_out_of_range);
                    return;
                }
                this->set_error (parser, parser.callbacks ().double_value (xf));
            }